

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::EndTable(void)

{
  float *pfVar1;
  ImVec2 *pIVar2;
  ImVec4 *pIVar3;
  float fVar4;
  float fVar5;
  char cVar6;
  ImGuiWindow *window;
  ImGuiWindow *pIVar7;
  ImDrawListSplitter *this;
  ulong uVar8;
  ImVec2 IVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  int iVar12;
  long lVar13;
  ImGuiTableTempData *pIVar14;
  char *pcVar15;
  ImGuiTableColumn *pIVar16;
  ImGuiTableColumn *column;
  ImGuiTable *pIVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  ImVec2 local_38;
  
  pIVar10 = GImGui;
  pIVar17 = GImGui->CurrentTable;
  if (pIVar17 == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Only call EndTable() if BeginTable() returns true!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4b3,"void ImGui::EndTable()");
  }
  if (pIVar17->IsLayoutLocked == false) {
    TableUpdateLayout(pIVar17);
  }
  window = pIVar17->InnerWindow;
  if (window != pIVar10->CurrentWindow) {
    __assert_fail("inner_window == g.CurrentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4c2,"void ImGui::EndTable()");
  }
  uVar20 = pIVar17->Flags;
  pIVar7 = pIVar17->OuterWindow;
  pIVar14 = pIVar17->TempData;
  if ((pIVar7 != window) && (pIVar7 != window->ParentWindow)) {
    __assert_fail("outer_window == inner_window || outer_window == inner_window->ParentWindow",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4c3,"void ImGui::EndTable()");
  }
  if (pIVar17->IsInsideRow == true) {
    TableEndRow(pIVar17);
  }
  if (((uVar20 & 0x20) != 0) && (pIVar17->HoveredColumnBody != -1)) {
    bVar11 = IsAnyItemHovered();
    if (!bVar11) {
      bVar11 = IsMouseReleased(1);
      if (bVar11) {
        TableOpenContextMenu((int)pIVar17->HoveredColumnBody);
      }
    }
  }
  (window->DC).PrevLineSize = pIVar14->HostBackupPrevLineSize;
  (window->DC).CurrLineSize = pIVar14->HostBackupCurrLineSize;
  (window->DC).CursorMaxPos = pIVar14->HostBackupCursorMaxPos;
  fVar4 = pIVar17->RowPosY2;
  pfVar1 = &(window->DC).CursorPos.y;
  if ((fVar4 != *pfVar1) || (NAN(fVar4) || NAN(*pfVar1))) {
    __assert_fail("table->RowPosY2 == inner_window->DC.CursorPos.y",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x4d2,"void ImGui::EndTable()");
  }
  if (pIVar7 == window) {
    if ((uVar20 >> 0x11 & 1) == 0) {
      fVar24 = (pIVar17->OuterRect).Max.y;
      uVar19 = -(uint)(fVar4 <= fVar24);
      fVar24 = (float)(~uVar19 & (uint)fVar4 | (uint)fVar24 & uVar19);
      (pIVar17->InnerRect).Max.y = fVar24;
      (pIVar17->OuterRect).Max.y = fVar24;
    }
  }
  else {
    (window->DC).CursorMaxPos.y = fVar4;
  }
  fVar24 = (pIVar17->WorkRect).Max.y;
  fVar23 = (pIVar17->OuterRect).Max.y;
  uVar19 = -(uint)(fVar23 <= fVar24);
  (pIVar17->WorkRect).Max.y = (float)(~uVar19 & (uint)fVar23 | (uint)fVar24 & uVar19);
  pIVar17->LastOuterHeight = fVar23 - (pIVar17->OuterRect).Min.y;
  if (((uint)pIVar17->Flags >> 0x18 & 1) != 0) {
    fVar24 = (pIVar17->InnerWindow->DC).CursorMaxPos.x;
    cVar6 = pIVar17->RightMostEnabledColumn;
    if ((long)cVar6 != -1) {
      if ((cVar6 < '\0') ||
         (pIVar16 = (pIVar17->Columns).Data + cVar6, (pIVar17->Columns).DataEnd <= pIVar16))
      goto LAB_00160da5;
      fVar23 = 0.0;
      if (((uint)pIVar17->Flags >> 10 & 1) != 0) {
        fVar23 = 1.0;
      }
      fVar23 = (pIVar16->WorkMaxX + pIVar17->CellPaddingX + pIVar17->OuterPaddingX) - fVar23;
      uVar19 = -(uint)(fVar23 <= fVar24);
      fVar24 = (float)(uVar19 & (uint)fVar24 | ~uVar19 & (uint)fVar23);
    }
    if (pIVar17->ResizedColumn != -1) {
      uVar19 = -(uint)(pIVar17->ResizeLockMinContentsX2 <= fVar24);
      fVar24 = (float)((uint)fVar24 & uVar19 | ~uVar19 & (uint)pIVar17->ResizeLockMinContentsX2);
    }
    (pIVar17->InnerWindow->DC).CursorMaxPos.x = fVar24;
  }
  if ((uVar20 >> 0x14 & 1) == 0) {
    ImDrawList::PopClipRect(window->DrawList);
  }
  lVar13 = (long)(window->DrawList->_ClipRectStack).Size;
  if (lVar13 < 1) {
    pcVar15 = "T &ImVector<ImVec4>::back() [T = ImVec4]";
    goto LAB_00160e6c;
  }
  pIVar3 = (window->DrawList->_ClipRectStack).Data + lVar13 + -1;
  fVar24 = pIVar3->y;
  fVar23 = pIVar3->z;
  fVar22 = pIVar3->w;
  (window->ClipRect).Min.x = pIVar3->x;
  (window->ClipRect).Min.y = fVar24;
  (window->ClipRect).Max.x = fVar23;
  (window->ClipRect).Max.y = fVar22;
  if ((uVar20 & 0x780) != 0) {
    TableDrawBorders(pIVar17);
  }
  this = pIVar17->DrawSplitter;
  ImDrawListSplitter::SetCurrentChannel(this,window->DrawList,0);
  if ((pIVar17->Flags & 0x100000) == 0) {
    TableMergeDrawChannels(pIVar17);
  }
  ImDrawListSplitter::Merge(this,window->DrawList);
  fVar24 = pIVar17->CellPaddingX + pIVar17->CellPaddingX;
  pIVar17->ColumnsAutoFitWidth =
       (float)(int)pIVar17->ColumnsEnabledCount * fVar24 +
       pIVar17->OuterPaddingX + pIVar17->OuterPaddingX +
       (float)(pIVar17->ColumnsEnabledCount + -1) *
       (pIVar17->CellSpacingX1 + pIVar17->CellSpacingX2);
  iVar12 = pIVar17->ColumnsCount;
  if (0 < (long)iVar12) {
    uVar8 = pIVar17->EnabledMaskByIndex;
    lVar13 = 0x10;
    uVar18 = 0;
    do {
      if ((uVar8 >> (uVar18 & 0x3f) & 1) != 0) {
        pIVar16 = (pIVar17->Columns).Data;
        column = (ImGuiTableColumn *)((long)pIVar16 + lVar13 + -0x10);
        if ((pIVar17->Columns).DataEnd <= column) goto LAB_00160da5;
        if ((column->Flags & 0x18U) == 8) {
          fVar23 = *(float *)((long)&pIVar16->Flags + lVar13);
        }
        else {
          fVar23 = TableGetColumnWidthAuto(pIVar17,column);
        }
        pIVar17->ColumnsAutoFitWidth = fVar23 + pIVar17->ColumnsAutoFitWidth;
      }
      uVar18 = uVar18 + 1;
      lVar13 = lVar13 + 0x68;
    } while ((long)iVar12 != uVar18);
  }
  if ((pIVar7 == window) || ((pIVar17->Flags & 0x1000000U) != 0)) {
    cVar6 = pIVar17->LastResizedColumn;
    if (((long)cVar6 != -1) &&
       (((pIVar17->ResizedColumn == -1 && (window->ScrollbarX == true)) &&
        (pIVar17->InstanceInteracted == pIVar17->InstanceCurrent)))) {
      if ((cVar6 < '\0') ||
         (pIVar16 = (pIVar17->Columns).Data + cVar6, (pIVar17->Columns).DataEnd <= pIVar16))
      goto LAB_00160da5;
      fVar24 = fVar24 + pIVar17->MinColumnWidth;
      fVar23 = pIVar16->MaxX;
      if ((pIVar17->InnerClipRect).Min.x <= fVar23) {
        pIVar2 = &(pIVar17->InnerClipRect).Max;
        if (fVar23 < pIVar2->x || fVar23 == pIVar2->x) goto LAB_001609e1;
        fVar24 = fVar24 + (fVar23 - (window->Pos).x);
      }
      else {
        fVar24 = (fVar23 - (window->Pos).x) - fVar24;
      }
      SetScrollFromPosX(window,fVar24,1.0);
    }
  }
  else {
    (window->Scroll).x = 0.0;
  }
LAB_001609e1:
  cVar6 = pIVar17->ResizedColumn;
  if (((long)cVar6 != -1) && (pIVar17->InstanceCurrent == pIVar17->InstanceInteracted)) {
    if ((cVar6 < '\0') ||
       (pIVar16 = (pIVar17->Columns).Data + cVar6, (pIVar17->Columns).DataEnd <= pIVar16)) {
LAB_00160da5:
      __assert_fail("p >= Data && p < DataEnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                    ,0x23b,"T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]");
    }
    pIVar17->ResizedColumnNextWidth =
         (float)(int)((((((pIVar10->IO).MousePos.x - (pIVar10->ActiveIdClickOffset).x) + 4.0) -
                       pIVar16->MinX) - pIVar17->CellSpacingX1) -
                     (pIVar17->CellPaddingX + pIVar17->CellPaddingX));
  }
  lVar13 = (long)(window->IDStack).Size;
  if (lVar13 < 1) {
    pcVar15 = "T &ImVector<unsigned int>::back() [T = unsigned int]";
LAB_00160e6c:
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                  ,0x695,pcVar15);
  }
  if ((window->IDStack).Data[lVar13 + -1] != (int)pIVar17->InstanceCurrent + pIVar17->ID) {
    __assert_fail("(inner_window->IDStack.back() == table->ID + table->InstanceCurrent) && \"Mismatching PushID/PopID!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x52c,"void ImGui::EndTable()");
  }
  if ((pIVar7->DC).ItemWidthStack.Size < pIVar14->HostBackupItemWidthStackSize) {
    __assert_fail("(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize) && \"Too many PopItemWidth!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x52d,"void ImGui::EndTable()");
  }
  PopID();
  fVar24 = (pIVar7->DC).CursorMaxPos.x;
  fVar23 = (pIVar7->DC).CursorMaxPos.y;
  IVar9 = (pIVar14->HostBackupWorkRect).Max;
  (window->WorkRect).Min = (pIVar14->HostBackupWorkRect).Min;
  (window->WorkRect).Max = IVar9;
  IVar9 = (pIVar14->HostBackupParentWorkRect).Max;
  (window->ParentWorkRect).Min = (pIVar14->HostBackupParentWorkRect).Min;
  (window->ParentWorkRect).Max = IVar9;
  window->SkipItems = pIVar17->HostSkipItems;
  (pIVar7->DC).CursorPos = (pIVar17->OuterRect).Min;
  (pIVar7->DC).ItemWidth = pIVar14->HostBackupItemWidth;
  (pIVar7->DC).ItemWidthStack.Size = pIVar14->HostBackupItemWidthStackSize;
  (pIVar7->DC).ColumnsOffset.x = (pIVar14->HostBackupColumnsOffset).x;
  if (pIVar7 == window) {
    local_38.x = (pIVar17->OuterRect).Max.x - (pIVar17->OuterRect).Min.x;
    local_38.y = (pIVar17->OuterRect).Max.y - (pIVar17->OuterRect).Min.y;
    ItemSize(&local_38,-1.0);
    ItemAdd(&pIVar17->OuterRect,0,(ImRect *)0x0,0);
  }
  else {
    EndChild();
  }
  uVar20 = pIVar17->Flags;
  if ((uVar20 >> 0x10 & 1) == 0) {
    fVar22 = (pIVar14->UserOuterSize).x;
    fVar21 = 0.0;
    if (fVar22 <= 0.0) {
      if ((uVar20 >> 0x18 & 1) != 0) {
        fVar21 = (window->ScrollbarSizes).x;
      }
      fVar25 = (pIVar17->OuterRect).Min.x + pIVar17->ColumnsAutoFitWidth;
      fVar5 = (pIVar7->DC).IdealMaxPos.x;
      fVar22 = (fVar21 + fVar25) - fVar22;
      uVar19 = -(uint)(fVar22 <= fVar5);
      (pIVar7->DC).IdealMaxPos.x = (float)(uVar19 & (uint)fVar5 | ~uVar19 & (uint)fVar22);
      fVar22 = (pIVar17->OuterRect).Max.x;
      if (fVar25 <= fVar22) {
        fVar22 = fVar25;
      }
    }
    else {
      fVar22 = (pIVar17->OuterRect).Max.x;
    }
  }
  else {
    if ((uVar20 >> 0x18 & 1) != 0) {
      __assert_fail("(table->Flags & ImGuiTableFlags_ScrollX) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                    ,0x54c,"void ImGui::EndTable()");
    }
    fVar22 = (pIVar17->OuterRect).Min.x + pIVar17->ColumnsAutoFitWidth;
  }
  uVar19 = -(uint)(fVar22 <= fVar24);
  (pIVar7->DC).CursorMaxPos.x = (float)(~uVar19 & (uint)fVar22 | (uint)fVar24 & uVar19);
  fVar24 = (pIVar14->UserOuterSize).y;
  fVar22 = 0.0;
  if (fVar24 <= 0.0) {
    if ((uVar20 >> 0x19 & 1) != 0) {
      fVar22 = (window->ScrollbarSizes).y;
    }
    fVar21 = (pIVar7->DC).IdealMaxPos.y;
    fVar24 = (fVar22 + fVar4) - fVar24;
    uVar20 = -(uint)(fVar24 <= fVar21);
    (pIVar7->DC).IdealMaxPos.y = (float)(uVar20 & (uint)fVar21 | ~uVar20 & (uint)fVar24);
    fVar24 = (pIVar17->OuterRect).Max.y;
    if (fVar4 <= fVar24) {
      fVar24 = fVar4;
    }
  }
  else {
    fVar24 = (pIVar17->OuterRect).Max.y;
  }
  uVar20 = -(uint)(fVar24 <= fVar23);
  (pIVar7->DC).CursorMaxPos.y = (float)(~uVar20 & (uint)fVar24 | (uint)fVar23 & uVar20);
  if (pIVar17->IsSettingsDirty == true) {
    TableSaveSettings(pIVar17);
  }
  pIVar17->IsInitializing = false;
  if ((pIVar10->CurrentWindow != pIVar7) || (pIVar10->CurrentTable != pIVar17)) {
    __assert_fail("g.CurrentWindow == outer_window && g.CurrentTable == table",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x56b,"void ImGui::EndTable()");
  }
  iVar12 = pIVar10->CurrentTableStackIdx;
  if (iVar12 < 0) {
    __assert_fail("g.CurrentTableStackIdx >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_tables.cpp"
                  ,0x56c,"void ImGui::EndTable()");
  }
  pIVar10->CurrentTableStackIdx = iVar12 - 1U;
  if (iVar12 == 0) {
    pIVar14 = (ImGuiTableTempData *)0x0;
  }
  else {
    if ((pIVar10->TablesTempDataStack).Size < iVar12) {
      pcVar15 = "T &ImVector<ImGuiTableTempData>::operator[](int) [T = ImGuiTableTempData]";
      goto LAB_00160f3d;
    }
    pIVar14 = (pIVar10->TablesTempDataStack).Data + (iVar12 - 1U);
  }
  if (pIVar14 == (ImGuiTableTempData *)0x0) {
    pIVar17 = (ImGuiTable *)0x0;
  }
  else {
    iVar12 = pIVar14->TableIndex;
    if (((long)iVar12 < 0) || ((pIVar10->Tables).Buf.Size <= iVar12)) {
      pcVar15 = "T &ImVector<ImGuiTable>::operator[](int) [T = ImGuiTable]";
LAB_00160f3d:
      __assert_fail("i >= 0 && i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                    ,0x68b,pcVar15);
    }
    pIVar17 = (pIVar10->Tables).Buf.Data + iVar12;
  }
  pIVar10->CurrentTable = pIVar17;
  if (pIVar17 == (ImGuiTable *)0x0) {
    iVar12 = -1;
  }
  else {
    pIVar17->TempData = pIVar14;
    pIVar17->DrawSplitter = &pIVar14->DrawSplitter;
    iVar12 = ImPool<ImGuiTable>::GetIndex(&pIVar10->Tables,pIVar17);
  }
  (pIVar7->DC).CurrentTableIdx = iVar12;
  return;
}

Assistant:

void    ImGui::EndTable()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Only call EndTable() if BeginTable() returns true!");

    // This assert would be very useful to catch a common error... unfortunately it would probably trigger in some
    // cases, and for consistency user may sometimes output empty tables (and still benefit from e.g. outer border)
    //IM_ASSERT(table->IsLayoutLocked && "Table unused: never called TableNextRow(), is that the intent?");

    // If the user never got to call TableNextRow() or TableNextColumn(), we call layout ourselves to ensure all our
    // code paths are consistent (instead of just hoping that TableBegin/TableEnd will work), get borders drawn, etc.
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    const ImGuiTableFlags flags = table->Flags;
    ImGuiWindow* inner_window = table->InnerWindow;
    ImGuiWindow* outer_window = table->OuterWindow;
    ImGuiTableTempData* temp_data = table->TempData;
    IM_ASSERT(inner_window == g.CurrentWindow);
    IM_ASSERT(outer_window == inner_window || outer_window == inner_window->ParentWindow);

    if (table->IsInsideRow)
        TableEndRow(table);

    // Context menu in columns body
    if (flags & ImGuiTableFlags_ContextMenuInBody)
        if (table->HoveredColumnBody != -1 && !IsAnyItemHovered() && IsMouseReleased(ImGuiMouseButton_Right))
            TableOpenContextMenu((int)table->HoveredColumnBody);

    // Finalize table height
    inner_window->DC.PrevLineSize = temp_data->HostBackupPrevLineSize;
    inner_window->DC.CurrLineSize = temp_data->HostBackupCurrLineSize;
    inner_window->DC.CursorMaxPos = temp_data->HostBackupCursorMaxPos;
    const float inner_content_max_y = table->RowPosY2;
    IM_ASSERT(table->RowPosY2 == inner_window->DC.CursorPos.y);
    if (inner_window != outer_window)
        inner_window->DC.CursorMaxPos.y = inner_content_max_y;
    else if (!(flags & ImGuiTableFlags_NoHostExtendY))
        table->OuterRect.Max.y = table->InnerRect.Max.y = ImMax(table->OuterRect.Max.y, inner_content_max_y); // Patch OuterRect/InnerRect height
    table->WorkRect.Max.y = ImMax(table->WorkRect.Max.y, table->OuterRect.Max.y);
    table->LastOuterHeight = table->OuterRect.GetHeight();

    // Setup inner scrolling range
    // FIXME: This ideally should be done earlier, in BeginTable() SetNextWindowContentSize call, just like writing to inner_window->DC.CursorMaxPos.y,
    // but since the later is likely to be impossible to do we'd rather update both axises together.
    if (table->Flags & ImGuiTableFlags_ScrollX)
    {
        const float outer_padding_for_border = (table->Flags & ImGuiTableFlags_BordersOuterV) ? TABLE_BORDER_SIZE : 0.0f;
        float max_pos_x = table->InnerWindow->DC.CursorMaxPos.x;
        if (table->RightMostEnabledColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->Columns[table->RightMostEnabledColumn].WorkMaxX + table->CellPaddingX + table->OuterPaddingX - outer_padding_for_border);
        if (table->ResizedColumn != -1)
            max_pos_x = ImMax(max_pos_x, table->ResizeLockMinContentsX2);
        table->InnerWindow->DC.CursorMaxPos.x = max_pos_x;
    }

    // Pop clipping rect
    if (!(flags & ImGuiTableFlags_NoClip))
        inner_window->DrawList->PopClipRect();
    inner_window->ClipRect = inner_window->DrawList->_ClipRectStack.back();

    // Draw borders
    if ((flags & ImGuiTableFlags_Borders) != 0)
        TableDrawBorders(table);

#if 0
    // Strip out dummy channel draw calls
    // We have no way to prevent user submitting direct ImDrawList calls into a hidden column (but ImGui:: calls will be clipped out)
    // Pros: remove draw calls which will have no effect. since they'll have zero-size cliprect they may be early out anyway.
    // Cons: making it harder for users watching metrics/debugger to spot the wasted vertices.
    if (table->DummyDrawChannel != (ImGuiTableColumnIdx)-1)
    {
        ImDrawChannel* dummy_channel = &table->DrawSplitter._Channels[table->DummyDrawChannel];
        dummy_channel->_CmdBuffer.resize(0);
        dummy_channel->_IdxBuffer.resize(0);
    }
#endif

    // Flatten channels and merge draw calls
    ImDrawListSplitter* splitter = table->DrawSplitter;
    splitter->SetCurrentChannel(inner_window->DrawList, 0);
    if ((table->Flags & ImGuiTableFlags_NoClip) == 0)
        TableMergeDrawChannels(table);
    splitter->Merge(inner_window->DrawList);

    // Update ColumnsAutoFitWidth to get us ahead for host using our size to auto-resize without waiting for next BeginTable()
    const float width_spacings = (table->OuterPaddingX * 2.0f) + (table->CellSpacingX1 + table->CellSpacingX2) * (table->ColumnsEnabledCount - 1);
    table->ColumnsAutoFitWidth = width_spacings + (table->CellPaddingX * 2.0f) * table->ColumnsEnabledCount;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        if (table->EnabledMaskByIndex & ((ImU64)1 << column_n))
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if ((column->Flags & ImGuiTableColumnFlags_WidthFixed) && !(column->Flags & ImGuiTableColumnFlags_NoResize))
                table->ColumnsAutoFitWidth += column->WidthRequest;
            else
                table->ColumnsAutoFitWidth += TableGetColumnWidthAuto(table, column);
        }

    // Update scroll
    if ((table->Flags & ImGuiTableFlags_ScrollX) == 0 && inner_window != outer_window)
    {
        inner_window->Scroll.x = 0.0f;
    }
    else if (table->LastResizedColumn != -1 && table->ResizedColumn == -1 && inner_window->ScrollbarX && table->InstanceInteracted == table->InstanceCurrent)
    {
        // When releasing a column being resized, scroll to keep the resulting column in sight
        const float neighbor_width_to_keep_visible = table->MinColumnWidth + table->CellPaddingX * 2.0f;
        ImGuiTableColumn* column = &table->Columns[table->LastResizedColumn];
        if (column->MaxX < table->InnerClipRect.Min.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x - neighbor_width_to_keep_visible, 1.0f);
        else if (column->MaxX > table->InnerClipRect.Max.x)
            SetScrollFromPosX(inner_window, column->MaxX - inner_window->Pos.x + neighbor_width_to_keep_visible, 1.0f);
    }

    // Apply resizing/dragging at the end of the frame
    if (table->ResizedColumn != -1 && table->InstanceCurrent == table->InstanceInteracted)
    {
        ImGuiTableColumn* column = &table->Columns[table->ResizedColumn];
        const float new_x2 = (g.IO.MousePos.x - g.ActiveIdClickOffset.x + TABLE_RESIZE_SEPARATOR_HALF_THICKNESS);
        const float new_width = ImFloor(new_x2 - column->MinX - table->CellSpacingX1 - table->CellPaddingX * 2.0f);
        table->ResizedColumnNextWidth = new_width;
    }

    // Pop from id stack
    IM_ASSERT_USER_ERROR(inner_window->IDStack.back() == table->ID + table->InstanceCurrent, "Mismatching PushID/PopID!");
    IM_ASSERT_USER_ERROR(outer_window->DC.ItemWidthStack.Size >= temp_data->HostBackupItemWidthStackSize, "Too many PopItemWidth!");
    PopID();

    // Restore window data that we modified
    const ImVec2 backup_outer_max_pos = outer_window->DC.CursorMaxPos;
    inner_window->WorkRect = temp_data->HostBackupWorkRect;
    inner_window->ParentWorkRect = temp_data->HostBackupParentWorkRect;
    inner_window->SkipItems = table->HostSkipItems;
    outer_window->DC.CursorPos = table->OuterRect.Min;
    outer_window->DC.ItemWidth = temp_data->HostBackupItemWidth;
    outer_window->DC.ItemWidthStack.Size = temp_data->HostBackupItemWidthStackSize;
    outer_window->DC.ColumnsOffset = temp_data->HostBackupColumnsOffset;

    // Layout in outer window
    // (FIXME: To allow auto-fit and allow desirable effect of SameLine() we dissociate 'used' vs 'ideal' size by overriding
    // CursorPosPrevLine and CursorMaxPos manually. That should be a more general layout feature, see same problem e.g. #3414)
    if (inner_window != outer_window)
    {
        EndChild();
    }
    else
    {
        ItemSize(table->OuterRect.GetSize());
        ItemAdd(table->OuterRect, 0);
    }

    // Override declared contents width/height to enable auto-resize while not needlessly adding a scrollbar
    if (table->Flags & ImGuiTableFlags_NoHostExtendX)
    {
        // FIXME-TABLE: Could we remove this section?
        // ColumnsAutoFitWidth may be one frame ahead here since for Fixed+NoResize is calculated from latest contents
        IM_ASSERT((table->Flags & ImGuiTableFlags_ScrollX) == 0);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth);
    }
    else if (temp_data->UserOuterSize.x <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollX) ? inner_window->ScrollbarSizes.x : 0.0f;
        outer_window->DC.IdealMaxPos.x = ImMax(outer_window->DC.IdealMaxPos.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth + decoration_size - temp_data->UserOuterSize.x);
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, ImMin(table->OuterRect.Max.x, table->OuterRect.Min.x + table->ColumnsAutoFitWidth));
    }
    else
    {
        outer_window->DC.CursorMaxPos.x = ImMax(backup_outer_max_pos.x, table->OuterRect.Max.x);
    }
    if (temp_data->UserOuterSize.y <= 0.0f)
    {
        const float decoration_size = (table->Flags & ImGuiTableFlags_ScrollY) ? inner_window->ScrollbarSizes.y : 0.0f;
        outer_window->DC.IdealMaxPos.y = ImMax(outer_window->DC.IdealMaxPos.y, inner_content_max_y + decoration_size - temp_data->UserOuterSize.y);
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, ImMin(table->OuterRect.Max.y, inner_content_max_y));
    }
    else
    {
        // OuterRect.Max.y may already have been pushed downward from the initial value (unless ImGuiTableFlags_NoHostExtendY is set)
        outer_window->DC.CursorMaxPos.y = ImMax(backup_outer_max_pos.y, table->OuterRect.Max.y);
    }

    // Save settings
    if (table->IsSettingsDirty)
        TableSaveSettings(table);
    table->IsInitializing = false;

    // Clear or restore current table, if any
    IM_ASSERT(g.CurrentWindow == outer_window && g.CurrentTable == table);
    IM_ASSERT(g.CurrentTableStackIdx >= 0);
    g.CurrentTableStackIdx--;
    temp_data = g.CurrentTableStackIdx >= 0 ? &g.TablesTempDataStack[g.CurrentTableStackIdx] : NULL;
    g.CurrentTable = temp_data ? g.Tables.GetByIndex(temp_data->TableIndex) : NULL;
    if (g.CurrentTable)
    {
        g.CurrentTable->TempData = temp_data;
        g.CurrentTable->DrawSplitter = &temp_data->DrawSplitter;
    }
    outer_window->DC.CurrentTableIdx = g.CurrentTable ? g.Tables.GetIndex(g.CurrentTable) : -1;
}